

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O1

int run_test_tcp_close(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  void *pvVar3;
  uv_tcp_t *extraout_RAX;
  uv_tcp_t *puVar4;
  undefined8 unaff_RBX;
  code **__ptr;
  int64_t eval_b_1;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  code *apcStack_168 [2];
  undefined8 uStack_158;
  long lStack_150;
  undefined1 auStack_148 [16];
  undefined8 uStack_138;
  long local_108 [2];
  undefined8 local_f8;
  undefined1 local_f0 [16];
  long local_e0 [27];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_f0);
  local_e0[0] = (long)iVar1;
  local_108[0] = 0;
  if (local_e0[0] == 0) {
    unaff_RBX = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_108);
    local_e0[0] = (long)iVar1;
    if (local_e0[0] != 0) goto LAB_001ca175;
    iVar1 = uv_tcp_init(unaff_RBX,local_e0);
    local_f8 = 0;
    if (iVar1 != 0) goto LAB_001ca184;
    iVar1 = uv_tcp_bind(local_e0,local_108,0);
    local_f8 = 0;
    if (iVar1 != 0) goto LAB_001ca193;
    iVar1 = uv_listen(local_e0,0x80,connection_cb);
    local_f8 = 0;
    if (iVar1 != 0) goto LAB_001ca1a2;
    uv_unref(local_e0);
    iVar1 = uv_tcp_init(unaff_RBX,&tcp_handle);
    local_108[0] = (long)iVar1;
    if (local_108[0] != 0) goto LAB_001ca1b1;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,local_f0,connect_cb);
    local_108[0] = (long)iVar1;
    if (local_108[0] != 0) goto LAB_001ca1c0;
    local_108[0] = (long)write_cb_called;
    if (local_108[0] != 0) goto LAB_001ca1cf;
    local_108[0] = (long)close_cb_called;
    if (local_108[0] != 0) goto LAB_001ca1de;
    iVar1 = uv_run(unaff_RBX,0);
    local_108[0] = (long)iVar1;
    if (local_108[0] != 0) goto LAB_001ca1ed;
    printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
    local_108[0] = (long)write_cb_called;
    if (local_108[0] != 0x20) goto LAB_001ca1fc;
    local_108[0] = 1;
    if (close_cb_called == 1) {
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      local_108[0] = 0;
      iVar1 = uv_loop_close(unaff_RBX);
      if (local_108[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ca21a;
    }
  }
  else {
    run_test_tcp_close_cold_1();
LAB_001ca175:
    run_test_tcp_close_cold_2();
LAB_001ca184:
    run_test_tcp_close_cold_3();
LAB_001ca193:
    run_test_tcp_close_cold_4();
LAB_001ca1a2:
    run_test_tcp_close_cold_5();
LAB_001ca1b1:
    run_test_tcp_close_cold_6();
LAB_001ca1c0:
    run_test_tcp_close_cold_7();
LAB_001ca1cf:
    run_test_tcp_close_cold_8();
LAB_001ca1de:
    run_test_tcp_close_cold_9();
LAB_001ca1ed:
    run_test_tcp_close_cold_10();
LAB_001ca1fc:
    run_test_tcp_close_cold_11();
  }
  run_test_tcp_close_cold_12();
LAB_001ca21a:
  run_test_tcp_close_cold_13();
  apcStack_168[0] = (code *)0x1ca244;
  uStack_138 = unaff_RBX;
  auStack_148 = uv_buf_init("PING",4);
  iVar1 = 0x20;
  while( true ) {
    apcStack_168[0] = (code *)0x1ca26d;
    pvVar3 = malloc(200);
    if (pvVar3 == (void *)0x0) break;
    apcStack_168[0] = (code *)0x1ca288;
    iVar2 = uv_write(pvVar3,&tcp_handle,auStack_148,1,write_cb);
    lStack_150 = (long)iVar2;
    uStack_158 = 0;
    if (lStack_150 != 0) goto LAB_001ca2cb;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      apcStack_168[0] = (code *)0x1ca2bb;
      iVar1 = uv_close(&tcp_handle,close_cb);
      return iVar1;
    }
  }
  apcStack_168[0] = (code *)0x1ca2cb;
  connect_cb_cold_2();
LAB_001ca2cb:
  iVar1 = (int)&uStack_158;
  __ptr = apcStack_168;
  apcStack_168[0] = connection_cb;
  connect_cb_cold_1();
  apcStack_168[0] = (code *)(long)iVar1;
  if (apcStack_168[0] == (code *)0x0) {
    return iVar1;
  }
  connection_cb_cold_1();
  if (close_cb_called == 0) {
    puVar4 = *(uv_tcp_t **)((long)__ptr + 0x58);
    if (puVar4 == &tcp_handle) {
      write_cb_called = write_cb_called + 1;
      free(__ptr);
      return extraout_EAX;
    }
  }
  else {
    write_cb_cold_1();
    puVar4 = extraout_RAX;
  }
  write_cb_cold_2();
  if (puVar4 == &tcp_handle) {
    close_cb_called = close_cb_called + 1;
    return 0x37ee28;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT_EQ(write_cb_called, NUM_WRITE_REQS);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}